

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O2

void irem_ga20_w(void *info,UINT8 offset,UINT8 data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  IremGA20_channel_def *ch;
  
  uVar2 = offset & 0x1f;
  *(UINT8 *)((long)info + (ulong)uVar2 + 0x2c) = data;
  uVar2 = uVar2 >> 3;
  ch = (IremGA20_channel_def *)((long)info + (ulong)uVar2 * 0x1c + 0x4c);
  switch(offset & 7) {
  case 0:
    uVar2 = ch->start & 0xff000;
    uVar1 = (uint)data << 4;
    break;
  case 1:
    uVar2 = ch->start & 0xff0;
    uVar1 = (uint)data << 0xc;
    break;
  case 2:
    uVar1 = *(uint *)((long)info + (ulong)uVar2 * 0x1c + 0x50) & 0xff000;
    uVar3 = (uint)data << 4;
    goto LAB_001594fa;
  case 3:
    uVar1 = *(uint *)((long)info + (ulong)uVar2 * 0x1c + 0x50) & 0xff0;
    uVar3 = (uint)data << 0xc;
LAB_001594fa:
    *(uint *)((long)info + (ulong)uVar2 * 0x1c + 0x50) = uVar3 | uVar1;
    return;
  case 4:
    *(UINT8 *)((long)info + (ulong)uVar2 * 0x1c + 0x62) = data;
    *(int *)((long)info + (ulong)uVar2 * 0x1c + 0x5c) = (int)(0x10000 / (ulong)(0x100 - data));
    return;
  case 5:
    *(short *)((long)info + (ulong)uVar2 * 0x1c + 0x60) = (short)(((uint)data << 8) / (data + 10));
    return;
  case 6:
    if ((data & 2) != 0) {
      *(undefined1 *)((long)info + (ulong)uVar2 * 0x1c + 100) = 1;
      *(UINT32 *)((long)info + (ulong)uVar2 * 0x1c + 0x54) = ch->start;
      *(undefined1 *)((long)info + (ulong)uVar2 * 0x1c + 99) =
           *(undefined1 *)((long)info + (ulong)uVar2 * 0x1c + 0x62);
      *(undefined4 *)((long)info + (ulong)uVar2 * 0x1c + 0x58) = 0;
      irem_ga20_cache_samples((ga20_state *)info,ch);
      return;
    }
    *(undefined1 *)((long)info + (ulong)uVar2 * 0x1c + 100) = 0;
  case 7:
    return;
  }
  ch->start = uVar1 | uVar2;
  return;
}

Assistant:

static void irem_ga20_w(void *info, UINT8 offset, UINT8 data)
{
	ga20_state *chip = (ga20_state *)info;
	struct IremGA20_channel_def* ch;
	int channel;

	//emu_logf(&chip->logger, DEVLOG_DEBUG, Offset %02x, data %04x\n",offset,data);

	offset &= 0x1F;
	channel = offset >> 3;

	chip->regs[offset] = data;

	// channel regs:
	// 0,1: start address
	// 2,3: end? address
	// 4: rate
	// 5: volume
	// 6: control
	// 7: voice status (read-only)

	ch = &chip->channel[channel];
	switch (offset & 0x7)
	{
		case 0: /* start address low */
			ch->start = (ch->start&0xff000) | (data<<4);
			break;

		case 1: /* start address high */
			ch->start = (ch->start&0x00ff0) | (data<<12);
			break;

		case 2: /* end? address low */
			ch->end = (ch->end&0xff000) | (data<<4);
			break;

		case 3: /* end? address high */
			ch->end = (ch->end&0x00ff0) | (data<<12);
			break;

		case 4:
			ch->rate = data;
			ch->fracrate = (1 << RATE_SHIFT) / (0x100 - ch->rate);
			break;

		case 5: //AT: gain control
			ch->volume = (data * MAX_VOL) / (data + 10);
			break;

		case 6: //AT: this is always written 2(enabling both channels?)
			// d1: key on/off
			if (data & 2)
			{
				ch->play = 1;
				ch->pos = ch->start;
				ch->counter = ch->rate;
				ch->frac = 0;
				irem_ga20_cache_samples(chip, ch);
			}
			else
			{
				ch->play = 0;
			}

			// other: unknown/unused
			// possibilities are: loop flag, left/right speaker(stereo)
			break;
	}
}